

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase::
ProducerBase(ProducerBase *this,
            ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *parent_,
            bool isExplicit_)

{
  byte in_DL;
  undefined8 in_RSI;
  ConcurrentQueueProducerTypelessBase *in_RDI;
  __integral_type in_stack_ffffffffffffffd8;
  
  details::ConcurrentQueueProducerTypelessBase::ConcurrentQueueProducerTypelessBase(in_RDI);
  in_RDI->next = (ConcurrentQueueProducerTypelessBase *)&PTR__ProducerBase_00252730;
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,in_stack_ffffffffffffffd8);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,in_stack_ffffffffffffffd8);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,in_stack_ffffffffffffffd8);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[2].token = (ProducerToken *)0x0;
  *(byte *)&in_RDI[3].next = in_DL & 1;
  *(undefined8 *)&in_RDI[3].inactive = in_RSI;
  return;
}

Assistant:

ProducerBase(ConcurrentQueue* parent_, bool isExplicit_) :
            tailIndex(0),
            headIndex(0),
            dequeueOptimisticCount(0),
            dequeueOvercommit(0),
            tailBlock(nullptr),
            isExplicit(isExplicit_),
            parent(parent_)
        {
        }